

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O1

bool __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,SequenceBegin sb,Range *input)

{
  OstreamBuffer *this_00;
  char *pcVar1;
  
  comma(this);
  if ((sb.tag._len == 1) && (*sb.tag._ptr == 'c')) {
    this_00 = this->_out;
    Range::throw_if_overflow(input,sb.size);
    pcVar1 = input->_begin;
    input->_begin = pcVar1 + sb.size;
    detail::OstreamBuffer::write(this_00,(int)pcVar1,(void *)sb.size,(size_t)sb.tag._ptr);
    return true;
  }
  detail::OstreamBuffer::put(this->_out,'[');
  this->_state = SeqBegin;
  this->_seqDepth = this->_seqDepth + 1;
  return false;
}

Assistant:

bool ToStringVisitor::visit(mserialize::Visitor::SequenceBegin sb, Range& input)
{
  comma();

  if (sb.tag.size() == 1 && sb.tag[0] == 'c') // skip char-by-char visitation of strings
  {
    _out.write(input.view(sb.size), sb.size);
    return true;
  }

  _out.put('[');
  enterSeq();

  return false;
}